

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O2

uint32_t __thiscall
cereal::InputArchive<cereal::BinaryInputArchive,_1U>::
loadClassVersion<eos::morphablemodel::MorphableModel>
          (InputArchive<cereal::BinaryInputArchive,_1U> *this)

{
  int iVar1;
  iterator iVar2;
  uint32_t version;
  uint32_t local_1c;
  
  if (InputArchive<cereal::BinaryInputArchive,1u>::
      loadClassVersion<eos::morphablemodel::MorphableModel>()::hash == '\0') {
    iVar1 = __cxa_guard_acquire(&InputArchive<cereal::BinaryInputArchive,1u>::
                                 loadClassVersion<eos::morphablemodel::MorphableModel>()::hash);
    if (iVar1 != 0) {
      loadClassVersion<eos::morphablemodel::MorphableModel>::hash =
           std::type_info::hash_code((type_info *)&eos::morphablemodel::MorphableModel::typeinfo);
      __cxa_guard_release(&InputArchive<cereal::BinaryInputArchive,1u>::
                           loadClassVersion<eos::morphablemodel::MorphableModel>()::hash);
    }
  }
  iVar2 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->itsVersionedTypes)._M_h,
                 &loadClassVersion<eos::morphablemodel::MorphableModel>::hash);
  if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false>._M_cur ==
      (__node_type *)0x0) {
    InputArchive<cereal::BinaryInputArchive,1u>::process<unsigned_int&>
              ((InputArchive<cereal::BinaryInputArchive,1u> *)this,&local_1c);
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_long_const&,unsigned_int&>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->itsVersionedTypes,
               &loadClassVersion<eos::morphablemodel::MorphableModel>::hash,&local_1c);
  }
  else {
    local_1c = *(uint32_t *)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false>
                       ._M_cur + 0x10);
  }
  return local_1c;
}

Assistant:

inline
      std::uint32_t loadClassVersion()
      {
        static const auto hash = std::type_index(typeid(T)).hash_code();
        auto lookupResult = itsVersionedTypes.find( hash );

        if( lookupResult != itsVersionedTypes.end() ) // already exists
          return lookupResult->second;
        else // need to load
        {
          std::uint32_t version;

          process( make_nvp<ArchiveType>("cereal_class_version", version) );
          itsVersionedTypes.emplace_hint( lookupResult, hash, version );

          return version;
        }
      }